

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O3

_Bool adt_bytearray_data_equals(adt_bytearray_t *self,uint8_t *data,uint32_t dataLen)

{
  int iVar1;
  
  if ((data != (uint8_t *)0x0 && self != (adt_bytearray_t *)0x0) && (self->u32CurLen == dataLen)) {
    if (dataLen != 0) {
      iVar1 = bcmp(self->pData,data,(ulong)dataLen);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool adt_bytearray_data_equals(const adt_bytearray_t* self, const uint8_t* data, uint32_t dataLen)
{
   if ( (self != 0) && (data != 0) )
   {
      uint32_t myLen;
      myLen = adt_bytearray_length(self);
      if (myLen == dataLen)
      {
         const uint8_t* myData = self->pData;
         if (myLen == 0u)
         {
            return true;
         }
         else
         {
            return (memcmp(myData, data, myLen) == 0) ? true : false;
         }
      }
   }
   return false;
}